

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::user_cache_directory
               (SmallVectorImpl<char> *Result,Twine *Path1,Twine *Path2,Twine *Path3)

{
  Twine *c;
  Twine *b;
  Twine *a;
  Twine *path;
  bool bVar1;
  Twine local_48;
  Twine *local_30;
  Twine *Path3_local;
  Twine *Path2_local;
  Twine *Path1_local;
  SmallVectorImpl<char> *Result_local;
  
  local_30 = Path3;
  Path3_local = Path2;
  Path2_local = Path1;
  Path1_local = (Twine *)Result;
  bVar1 = getUserCacheDir(Result);
  path = Path1_local;
  a = Path2_local;
  b = Path3_local;
  c = local_30;
  if (bVar1) {
    Twine::Twine(&local_48,"");
    append((SmallVectorImpl<char> *)path,a,b,c,&local_48);
  }
  return bVar1;
}

Assistant:

bool user_cache_directory(SmallVectorImpl<char> &Result, const Twine &Path1,
                          const Twine &Path2, const Twine &Path3) {
  if (getUserCacheDir(Result)) {
    append(Result, Path1, Path2, Path3);
    return true;
  }
  return false;
}